

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

RPCHelpMan * gettxoutsetinfo(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_20;
  string description_21;
  string description_22;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  undefined8 uVar11;
  RPCHelpMan *in_RDI;
  long *plVar12;
  long lVar13;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffe0b8;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffe0bc;
  undefined1 in_stack_ffffffffffffe0c0 [16];
  undefined8 in_stack_ffffffffffffe0d8;
  undefined8 in_stack_ffffffffffffe0e0;
  RPCResult *pRVar15;
  undefined8 in_stack_ffffffffffffe0e8;
  undefined8 in_stack_ffffffffffffe0f0;
  undefined8 in_stack_ffffffffffffe0f8;
  code *pcVar16;
  undefined8 in_stack_ffffffffffffe100;
  pointer in_stack_ffffffffffffe108;
  undefined8 in_stack_ffffffffffffe110;
  pointer in_stack_ffffffffffffe118;
  pointer pRVar17;
  pointer in_stack_ffffffffffffe120;
  pointer pRVar18;
  pointer in_stack_ffffffffffffe128;
  pointer pRVar19;
  undefined8 in_stack_ffffffffffffe130;
  pointer in_stack_ffffffffffffe138;
  pointer pRVar20;
  pointer in_stack_ffffffffffffe140;
  pointer pRVar21;
  pointer in_stack_ffffffffffffe148;
  undefined8 in_stack_ffffffffffffe150;
  pointer in_stack_ffffffffffffe158;
  pointer in_stack_ffffffffffffe160;
  pointer in_stack_ffffffffffffe168;
  undefined8 in_stack_ffffffffffffe170;
  pointer in_stack_ffffffffffffe178;
  pointer in_stack_ffffffffffffe180;
  pointer in_stack_ffffffffffffe188;
  undefined1 in_stack_ffffffffffffe190 [16];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1df8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1de0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1dc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1da8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ce8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1cc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ca8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c90;
  RPCResults local_1c78;
  allocator_type local_1c5b;
  bool local_1c5a;
  allocator_type local_1c59;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1c58;
  string local_1c40;
  string local_1c20;
  string local_1c00;
  string local_1be0;
  string local_1bc0;
  string local_1ba0;
  string local_1b80;
  string local_1b60;
  string local_1b40;
  string local_1b20;
  string local_1b00;
  string local_1ae0;
  string local_1ac0;
  string local_1aa0;
  string local_1a80;
  string local_1a60;
  string local_1a40;
  string local_1a20;
  string local_1a00;
  string local_19e0;
  string local_19c0;
  string local_19a0;
  string local_1980;
  string local_1960;
  string local_1940;
  string local_1920;
  string local_1900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1820;
  ulong *local_1800;
  undefined8 local_17f8;
  ulong local_17f0;
  undefined8 uStack_17e8;
  ulong *local_17e0;
  size_type local_17d8;
  ulong local_17d0;
  undefined8 uStack_17c8;
  long *local_17c0 [2];
  long local_17b0 [2];
  long *local_17a0 [2];
  long local_1790 [2];
  long *local_1780 [2];
  long local_1770 [2];
  long *local_1760 [2];
  long local_1750 [2];
  long *local_1740 [2];
  long local_1730 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1720;
  long *local_1700 [2];
  long local_16f0 [2];
  pointer local_16e0 [2];
  undefined1 local_16d0 [152];
  RPCResult local_1638;
  RPCResult local_15b0;
  RPCResult local_1528;
  long *local_14a0 [2];
  long local_1490 [2];
  long *local_1480 [2];
  long local_1470 [2];
  long *local_1460 [2];
  long local_1450 [2];
  long *local_1440 [2];
  long local_1430 [2];
  long *local_1420 [2];
  long local_1410 [2];
  long *local_1400 [2];
  long local_13f0 [2];
  long *local_13e0 [2];
  long local_13d0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_13c0;
  long *local_13a0 [2];
  long local_1390 [2];
  pointer local_1380 [2];
  undefined1 local_1370 [152];
  RPCResult local_12d8;
  RPCResult local_1250;
  RPCResult local_11c8;
  RPCResult local_1140;
  long *local_10b8 [2];
  long local_10a8 [2];
  long *local_1098 [2];
  long local_1088 [2];
  long *local_1078 [2];
  long local_1068 [2];
  long *local_1058 [2];
  long local_1048 [2];
  long *local_1038;
  undefined8 local_1030;
  long local_1028 [2];
  long *local_1018 [2];
  long local_1008 [2];
  long *local_ff8 [2];
  long local_fe8 [2];
  long *local_fd8 [2];
  long local_fc8 [2];
  long *local_fb8 [2];
  long local_fa8 [2];
  long *local_f98 [2];
  long local_f88 [2];
  long *local_f78 [2];
  long local_f68 [2];
  long *local_f58 [2];
  long local_f48 [2];
  long *local_f38 [2];
  long local_f28 [2];
  long *local_f18 [2];
  long local_f08 [2];
  long *local_ef8 [2];
  long local_ee8 [2];
  long *local_ed8 [2];
  long local_ec8 [2];
  long *local_eb8 [2];
  long local_ea8 [2];
  long *local_e98 [2];
  long local_e88 [2];
  long *local_e78 [2];
  long local_e68 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_e58;
  long *local_e38 [2];
  long local_e28 [2];
  pointer local_e18 [2];
  undefined1 local_e08 [152];
  RPCResult local_d70;
  RPCResult local_ce8;
  RPCResult local_c60;
  RPCResult local_bd8;
  RPCResult local_b50;
  RPCResult local_ac8;
  RPCResult local_a40;
  RPCResult local_9b8;
  RPCResult local_930;
  RPCResult local_8a8;
  long *local_820 [2];
  long local_810 [2];
  long *local_800 [2];
  long local_7f0 [2];
  RPCResult local_7e0;
  undefined1 local_758;
  undefined1 *local_750;
  undefined8 local_748;
  undefined1 local_740;
  undefined7 uStack_73f;
  undefined1 local_730 [32];
  long *local_710 [2];
  long local_700 [2];
  UniValue local_6f0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_698;
  undefined1 local_640;
  long *local_638 [2];
  long local_628 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  long *local_5f8 [2];
  long local_5e8 [2];
  undefined1 local_5d8;
  undefined1 *local_5d0;
  undefined8 local_5c8;
  undefined1 local_5c0;
  undefined7 uStack_5bf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b0;
  undefined2 local_598;
  long *local_590 [2];
  long local_580 [2];
  uint *local_570;
  undefined8 local_568;
  uint local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_550;
  undefined1 local_4f8;
  long *local_4f0 [2];
  long local_4e0 [2];
  undefined1 local_4d0;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  undefined1 local_4a8 [32];
  long *local_488 [2];
  long local_478;
  undefined1 auStack_470 [8];
  undefined1 local_468 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_440;
  vector<UniValue,_std::allocator<UniValue>_> local_428;
  undefined1 local_410 [40];
  long local_3e8 [6];
  __index_type local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"gettxoutsetinfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturns statistics about the unspent transaction output set.\nNote this call may take some time if you are not using coinstatsindex.\n"
             ,"");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"hash_type","");
  UniValue::UniValue<const_char_(&)[18],_char[18],_true>
            ((UniValue *)local_468,(char (*) [18])"hash_serialized_3");
  local_410._8_8_ = local_410 + 0x18;
  local_410._0_4_ = local_468._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._8_8_ == &local_450) {
    local_410._32_8_ = local_450._8_8_;
  }
  else {
    local_410._8_8_ = local_468._8_8_;
  }
  local_410._16_8_ = local_468._16_8_;
  local_468._16_8_ = 0;
  local_450._M_local_buf[0] = '\0';
  local_3e8[0] = (long)local_440.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_3e8[1] = (long)local_440.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_3e8[2] = (long)local_440.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_440.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_440.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_440.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8[3]._0_4_ =
       local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_3e8[3]._4_4_ =
       local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_3e8[4]._0_4_ =
       local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_3e8[4]._4_4_ =
       local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_3e8[5] = (long)local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_428.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3b8 = '\x02';
  local_488[0] = &local_478;
  local_468._8_8_ = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,
             "Which UTXO set hash should be calculated. Options: \'hash_serialized_3\' (the legacy algorithm), \'muhash\', \'none\'."
             ,"");
  local_4c8 = &local_4b8;
  local_4d0 = 0;
  local_4c0 = 0;
  local_4b8 = 0;
  local_4a8._0_8_ = (pointer)0x0;
  local_4a8._8_2_ = 0;
  local_4a8._10_6_ = 0;
  local_4a8._16_2_ = 0;
  local_4a8._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe0b8;
  name._8_16_ = in_stack_ffffffffffffe0c0;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe0e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe0d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe0e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe0f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe0f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe100;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe108;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe110;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe118;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe120;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe128;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe130;
  description_20._M_string_length = (size_type)in_stack_ffffffffffffe140;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe138;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe148;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe150;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe160;
  opts._0_8_ = in_stack_ffffffffffffe158;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe168;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe170;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe178;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe180;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe188;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe190._0_8_;
  opts.hidden = (bool)in_stack_ffffffffffffe190[8];
  opts.also_positional = (bool)in_stack_ffffffffffffe190[9];
  opts._66_6_ = in_stack_ffffffffffffe190._10_6_;
  RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_20,opts);
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"hash_or_height","");
  local_570 = &local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"the current best block","");
  local_550._0_8_ = (long)&local_550 + 0x10;
  if (local_570 == &local_560) {
    local_550._24_4_ = uStack_558;
    local_550._28_4_ = uStack_554;
  }
  else {
    local_550._0_8_ = local_570;
  }
  local_550._8_8_ = local_568;
  local_568 = 0;
  local_560 = local_560 & 0xffffff00;
  local_4f8 = 1;
  local_590[0] = local_580;
  local_570 = &local_560;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_590,
             "The block hash or height of the target height (only available with coinstatsindex).",
             "");
  local_5d0 = &local_5c0;
  local_5d8 = 1;
  local_5c8 = 0;
  local_5c0 = 0;
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"");
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"string or numeric","");
  __l._M_len = 2;
  __l._M_array = &local_618;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5b0,__l,&local_1c59);
  local_598 = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe0b8;
  name_00._8_16_ = in_stack_ffffffffffffe0c0;
  name_00.field_2._8_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe0e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe0d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe0e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe0f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe0f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe100;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe108;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe110;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe118;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe120;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe128;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe130;
  description_21._M_string_length = (size_type)in_stack_ffffffffffffe140;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe138;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe148;
  description_21.field_2._8_8_ = in_stack_ffffffffffffe150;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe160;
  opts_00._0_8_ = in_stack_ffffffffffffe158;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe168;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe170;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe178;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe180;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe188;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe190._0_8_;
  opts_00.hidden = (bool)in_stack_ffffffffffffe190[8];
  opts_00.also_positional = (bool)in_stack_ffffffffffffe190[9];
  opts_00._66_6_ = in_stack_ffffffffffffe190._10_6_;
  RPCArg::RPCArg(&local_288,name_00,(Type)local_4f0,fallback_00,description_21,opts_00);
  local_638[0] = local_628;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"use_index","");
  local_1c5a = true;
  UniValue::UniValue<bool,_bool,_true>(&local_6f0,&local_1c5a);
  paVar1 = &local_6f0.val.field_2;
  local_698._8_8_ = (long)&local_698 + 0x18;
  local_698._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_6f0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.val._M_dataplus._M_p == paVar1) {
    local_698._32_8_ = local_6f0.val.field_2._8_8_;
  }
  else {
    local_698._8_8_ = local_6f0.val._M_dataplus._M_p;
  }
  local_698._16_8_ = local_6f0.val._M_string_length;
  local_6f0.val._M_string_length = 0;
  local_6f0.val.field_2._M_local_buf[0] = '\0';
  local_698._40_8_ =
       local_6f0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_698._48_8_ =
       local_6f0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_698._56_8_ =
       local_6f0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6f0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6f0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_698._64_4_ =
       local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_698._68_4_ =
       local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_698._72_4_ =
       local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_698._76_4_ =
       local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_698._80_8_ =
       local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6f0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_640 = 2;
  local_710[0] = local_700;
  local_6f0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_710,"Use coinstatsindex, if available.","");
  local_750 = &local_740;
  local_758 = 0;
  local_748 = 0;
  local_740 = 0;
  local_730._0_8_ = (pointer)0x0;
  local_730._8_2_ = 0;
  local_730._10_6_ = 0;
  local_730._16_2_ = 0;
  local_730._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe0b8;
  name_01._8_16_ = in_stack_ffffffffffffe0c0;
  name_01.field_2._8_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe0e0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe0d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe0e8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe0f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe0f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe100;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe108;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe110;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe118;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe120;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe128;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe130;
  description_22._M_string_length = (size_type)in_stack_ffffffffffffe140;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe138;
  description_22.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe148;
  description_22.field_2._8_8_ = in_stack_ffffffffffffe150;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe160;
  opts_01._0_8_ = in_stack_ffffffffffffe158;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe168;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe170;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe178;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe180;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe188;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe190._0_8_;
  opts_01.hidden = (bool)in_stack_ffffffffffffe190[8];
  opts_01.also_positional = (bool)in_stack_ffffffffffffe190[9];
  opts_01._66_6_ = in_stack_ffffffffffffe190._10_6_;
  RPCArg::RPCArg(&local_180,name_01,(Type)local_638,fallback_01,description_22,opts_01);
  __l_00._M_len = 3;
  __l_00._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1c58,__l_00,&local_1c5b);
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"");
  local_e18[0] = (pointer)local_e08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e18,"height","");
  local_e38[0] = local_e28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e38,"The block height (index) of the returned statistics","");
  local_1ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe0b8;
  m_key_name._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffe0e0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe100;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            ((RPCResult *)(local_e08 + 0x10),NUM,m_key_name,description,inner,SUB81(local_e18,0));
  local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e58,"bestblock","");
  local_e78[0] = local_e68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e78,"The hash of the block at which these statistics are calculated",""
            );
  local_1cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe0b8;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffe0e0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult(&local_d70,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(&local_e58,0))
  ;
  local_e98[0] = local_e88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e98,"txouts","");
  local_eb8[0] = local_ea8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_eb8,"The number of unspent transaction outputs","");
  local_1ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe0b8;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffe0e0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult(&local_ce8,NUM,m_key_name_01,description_01,inner_01,SUB81(local_e98,0));
  local_ed8[0] = local_ec8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ed8,"bogosize","");
  local_ef8[0] = local_ee8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ef8,
             "Database-independent, meaningless metric indicating the UTXO set size","");
  local_1d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe0b8;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_02._M_string_length = in_stack_ffffffffffffe0e0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult(&local_c60,NUM,m_key_name_02,description_02,inner_02,SUB81(local_ed8,0));
  local_f18[0] = local_f08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f18,"hash_serialized_3","");
  local_f38[0] = local_f28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f38,
             "The serialized hash (only present if \'hash_serialized_3\' hash_type is chosen)","");
  local_1d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_16_ = in_stack_ffffffffffffe0c0;
  auVar4._0_4_ = in_stack_ffffffffffffe0bc;
  auVar4._20_8_ = in_RDI;
  auVar4._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffe0e0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_bd8,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_f18,0),description_03,inner_03,
             true);
  local_f58[0] = local_f48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f58,"muhash","");
  local_f78[0] = local_f68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f78,
             "The serialized hash (only present if \'muhash\' hash_type is chosen)","");
  local_1d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_16_ = in_stack_ffffffffffffe0c0;
  auVar5._0_4_ = in_stack_ffffffffffffe0bc;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffe0e0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_b50,STR_HEX,(string)(auVar5 << 0x20),SUB81(local_f58,0),description_04,inner_04,
             true);
  local_f98[0] = local_f88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f98,"transactions","");
  local_fb8[0] = local_fa8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fb8,
             "The number of transactions with unspent outputs (not available when coinstatsindex is used)"
             ,"");
  local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_16_ = in_stack_ffffffffffffe0c0;
  auVar6._0_4_ = in_stack_ffffffffffffe0bc;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffe0e0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_ac8,NUM,(string)(auVar6 << 0x20),SUB81(local_f98,0),description_05,inner_05,true
            );
  local_fd8[0] = local_fc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fd8,"disk_size","");
  local_ff8[0] = local_fe8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ff8,
             "The estimated size of the chainstate on disk (not available when coinstatsindex is used)"
             ,"");
  local_1d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar7._4_16_ = in_stack_ffffffffffffe0c0;
  auVar7._0_4_ = in_stack_ffffffffffffe0bc;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe0e0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_a40,NUM,(string)(auVar7 << 0x20),SUB81(local_fd8,0),description_06,inner_06,true
            );
  local_1018[0] = local_1008;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1018,"total_amount","");
  local_1038 = local_1028;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1038,"The total amount of coins in the UTXO set","");
  local_1da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_07._M_string_length = in_stack_ffffffffffffe0e0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_9b8,STR_AMOUNT,m_key_name_03,description_07,inner_07,SUB81(local_1018,0));
  local_1058[0] = local_1048;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1058,"total_unspendable_amount","");
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,
             "The total amount of coins permanently excluded from the UTXO set (only available if coinstatsindex is used)"
             ,"");
  local_1dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar8._4_16_ = in_stack_ffffffffffffe0c0;
  auVar8._0_4_ = in_stack_ffffffffffffe0bc;
  auVar8._20_8_ = in_RDI;
  auVar8._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe0e0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_930,STR_AMOUNT,(string)(auVar8 << 0x20),SUB81(local_1058,0),description_08,
             inner_08,true);
  local_1098[0] = local_1088;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1098,"block_info","");
  local_10b8[0] = local_10a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10b8,
             "Info on amounts in the block at this block height (only available if coinstatsindex is used)"
             ,"");
  local_1380[0] = (pointer)local_1370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1380,"prevout_spent","");
  local_13a0[0] = local_1390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a0,"Total amount of all prevouts spent in this block","");
  local_1df8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1df8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1df8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffe0e0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            ((RPCResult *)(local_1370 + 0x10),STR_AMOUNT,m_key_name_04,description_09,inner_09,
             SUB81(local_1380,0));
  local_13c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_13c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13c0,"coinbase","");
  local_13e0[0] = local_13d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e0,"Coinbase subsidy amount of this block","");
  local_1e18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_10._M_string_length = in_stack_ffffffffffffe0e0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_12d8,STR_AMOUNT,m_key_name_05,description_10,inner_10,SUB81(&local_13c0,0));
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1400,"new_outputs_ex_coinbase","")
  ;
  local_1420[0] = local_1410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1420,"Total amount of new outputs created by this block","");
  local_1e38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_11._M_string_length = in_stack_ffffffffffffe0e0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult(&local_1250,STR_AMOUNT,m_key_name_06,description_11,inner_11,false);
  local_1440[0] = local_1430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1440,"unspendable","");
  local_1460[0] = local_1450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1460,"Total amount of unspendable outputs created in this block","");
  local_1e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_07._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_12._M_string_length = in_stack_ffffffffffffe0e0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_11c8,STR_AMOUNT,m_key_name_07,description_12,inner_12,SUB81(local_1440,0));
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1480,"unspendables","");
  local_14a0[0] = local_1490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a0,"Detailed view of the unspendable categories","");
  local_16e0[0] = (pointer)local_16d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16e0,"genesis_block","");
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1700,"The unspendable amount of the Genesis block subsidy","");
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_08._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_08.field_2._8_8_ = in_RDI;
  description_13._M_string_length = in_stack_ffffffffffffe0e0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            ((RPCResult *)(local_16d0 + 0x10),STR_AMOUNT,m_key_name_08,description_13,inner_13,
             SUB81(local_16e0,0));
  pRVar15 = &local_1638;
  local_1720.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1720.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1720,"bip30","");
  local_1740[0] = local_1730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1740,
             "Transactions overridden by duplicates (no longer possible with BIP30)","");
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_09._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_09.field_2._8_8_ = in_RDI;
  description_14._M_string_length = (size_type)pRVar15;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_1638,STR_AMOUNT,m_key_name_09,description_14,inner_14,SUB81(&local_1720,0));
  pRVar15 = &local_15b0;
  local_1760[0] = local_1750;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1760,"scripts","");
  local_1780[0] = local_1770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1780,
             "Amounts sent to scripts that are unspendable (for example OP_RETURN outputs)","");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_10._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_10.field_2._8_8_ = in_RDI;
  description_15._M_string_length = (size_type)pRVar15;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_15b0,STR_AMOUNT,m_key_name_10,description_15,inner_15,SUB81(local_1760,0));
  pRVar15 = &local_1528;
  local_17a0[0] = local_1790;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17a0,"unclaimed_rewards","");
  local_17c0[0] = local_17b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c0,
             "Fee rewards that miners did not claim in their coinbase transaction","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_11._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_11.field_2._8_8_ = in_RDI;
  description_16._M_string_length = (size_type)pRVar15;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_1528,STR_AMOUNT,m_key_name_11,description_16,inner_16,SUB81(local_17a0,0));
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)(local_16d0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe190,__l_01,
             (allocator_type *)&stack0xffffffffffffe117);
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_12._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_12.field_2._8_8_ = in_RDI;
  description_17._M_string_length = (size_type)pRVar15;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_17.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult(&local_1140,OBJ,m_key_name_12,description_17,inner_17,SUB81(local_1480,0));
  __l_02._M_len = 5;
  __l_02._M_array = (iterator)(local_1370 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1de0,__l_02,(allocator_type *)&stack0xffffffffffffe116);
  uVar14 = 0;
  auVar9._4_16_ = in_stack_ffffffffffffe0c0;
  auVar9._0_4_ = in_stack_ffffffffffffe0bc;
  auVar9._20_8_ = in_RDI;
  auVar9._28_4_ = 0;
  description_18._M_string_length = (size_type)pRVar15;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_18.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult
            (&local_8a8,OBJ,(string)(auVar9 << 0x20),SUB81(local_1098,0),description_18,inner_18,
             true);
  __l_03._M_len = 0xb;
  __l_03._M_array = (iterator)(local_e08 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1c90,__l_03,(allocator_type *)&stack0xffffffffffffe115);
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe0bc;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_13._8_16_ = in_stack_ffffffffffffe0c0;
  m_key_name_13.field_2._8_8_ = in_RDI;
  description_19._M_string_length = (size_type)pRVar15;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0d8;
  description_19.field_2._M_allocated_capacity = in_stack_ffffffffffffe0e8;
  description_19.field_2._8_8_ = in_stack_ffffffffffffe0f0;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe100;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe0f8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe108;
  RPCResult::RPCResult(&local_7e0,OBJ,m_key_name_13,description_19,inner_19,false);
  result._4_4_ = in_stack_ffffffffffffe0bc;
  result.m_type = uVar14;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0c0._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe0c0._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe0d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar15;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe0e8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe0f0;
  result.m_optional = (bool)(char)in_stack_ffffffffffffe0f8;
  result.m_skip_type_check = (bool)(char)((ulong)in_stack_ffffffffffffe0f8 >> 8);
  result._66_6_ = (int6)((ulong)in_stack_ffffffffffffe0f8 >> 0x10);
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe100;
  result.m_description._M_string_length = (size_type)in_stack_ffffffffffffe108;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe110;
  result.m_description.field_2._8_8_ = pRVar17;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar18;
  result.m_cond._M_string_length = (size_type)pRVar19;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffe130;
  result.m_cond.field_2._8_8_ = pRVar20;
  RPCResults::RPCResults(&local_1c78,result);
  local_1920._M_dataplus._M_p = (pointer)&local_1920.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1920,"gettxoutsetinfo","");
  local_1940._M_dataplus._M_p = (pointer)&local_1940.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1940,"");
  HelpExampleCli(&local_1900,&local_1920,&local_1940);
  local_1980._M_dataplus._M_p = (pointer)&local_1980.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1980,"gettxoutsetinfo","");
  local_19a0._M_dataplus._M_p = (pointer)&local_19a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_19a0,"\"none\"","");
  HelpExampleCli(&local_1960,&local_1980,&local_19a0);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1900._M_dataplus._M_p != &local_1900.field_2) {
    uVar11 = local_1900.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1960._M_string_length + local_1900._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1960._M_dataplus._M_p != &local_1960.field_2) {
      uVar11 = local_1960.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1960._M_string_length + local_1900._M_string_length)
    goto LAB_009cf3cc;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1960,0,0,local_1900._M_dataplus._M_p,local_1900._M_string_length);
  }
  else {
LAB_009cf3cc:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1900,local_1960._M_dataplus._M_p,local_1960._M_string_length);
  }
  local_18e0._M_dataplus._M_p = (pointer)&local_18e0.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if (paVar2 == paVar1) {
    local_18e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_18e0.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_18e0.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_18e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_18e0._M_dataplus._M_p = (pointer)paVar2;
  }
  local_18e0._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_19e0._M_dataplus._M_p = (pointer)&local_19e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_19e0,"gettxoutsetinfo","");
  local_1a00._M_dataplus._M_p = (pointer)&local_1a00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a00,"\"none\" 1000","");
  HelpExampleCli(&local_19c0,&local_19e0,&local_1a00);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18e0._M_dataplus._M_p != &local_18e0.field_2) {
    uVar11 = local_18e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_19c0._M_string_length + local_18e0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_19c0._M_dataplus._M_p != &local_19c0.field_2) {
      uVar11 = local_19c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_19c0._M_string_length + local_18e0._M_string_length)
    goto LAB_009cf505;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_19c0,0,0,local_18e0._M_dataplus._M_p,local_18e0._M_string_length);
  }
  else {
LAB_009cf505:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_18e0,local_19c0._M_dataplus._M_p,local_19c0._M_string_length);
  }
  local_18c0._M_dataplus._M_p = (pointer)&local_18c0.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if (paVar2 == paVar1) {
    local_18c0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_18c0.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_18c0.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_18c0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_18c0._M_dataplus._M_p = (pointer)paVar2;
  }
  local_18c0._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1a40._M_dataplus._M_p = (pointer)&local_1a40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a40,"gettxoutsetinfo","");
  local_1a60._M_dataplus._M_p = (pointer)&local_1a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a60,
             "\"none\" \'\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"\'","")
  ;
  HelpExampleCli(&local_1a20,&local_1a40,&local_1a60);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18c0._M_dataplus._M_p != &local_18c0.field_2) {
    uVar11 = local_18c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1a20._M_string_length + local_18c0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a20._M_dataplus._M_p != &local_1a20.field_2) {
      uVar11 = local_1a20.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1a20._M_string_length + local_18c0._M_string_length)
    goto LAB_009cf63e;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1a20,0,0,local_18c0._M_dataplus._M_p,local_18c0._M_string_length);
  }
  else {
LAB_009cf63e:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_18c0,local_1a20._M_dataplus._M_p,local_1a20._M_string_length);
  }
  local_18a0._M_dataplus._M_p = (pointer)&local_18a0.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if (paVar2 == paVar1) {
    local_18a0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_18a0.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_18a0.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_18a0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_18a0._M_dataplus._M_p = (pointer)paVar2;
  }
  local_18a0._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1aa0._M_dataplus._M_p = (pointer)&local_1aa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1aa0,"-named gettxoutsetinfo","")
  ;
  local_1ac0._M_dataplus._M_p = (pointer)&local_1ac0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ac0,"hash_type=\'muhash\' use_index=\'false\'","");
  HelpExampleCli(&local_1a80,&local_1aa0,&local_1ac0);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
    uVar11 = local_18a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1a80._M_string_length + local_18a0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a80._M_dataplus._M_p != &local_1a80.field_2) {
      uVar11 = local_1a80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1a80._M_string_length + local_18a0._M_string_length)
    goto LAB_009cf777;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1a80,0,0,local_18a0._M_dataplus._M_p,local_18a0._M_string_length);
  }
  else {
LAB_009cf777:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_18a0,local_1a80._M_dataplus._M_p,local_1a80._M_string_length);
  }
  local_1880._M_dataplus._M_p = (pointer)&local_1880.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if (paVar2 == paVar1) {
    local_1880.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1880.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_1880.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_1880.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1880._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1880._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1b00._M_dataplus._M_p = (pointer)&local_1b00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b00,"gettxoutsetinfo","");
  local_1b20._M_dataplus._M_p = (pointer)&local_1b20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b20,"");
  HelpExampleRpc(&local_1ae0,&local_1b00,&local_1b20);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
    uVar11 = local_1880.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1ae0._M_string_length + local_1880._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1ae0._M_dataplus._M_p != &local_1ae0.field_2) {
      uVar11 = local_1ae0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1ae0._M_string_length + local_1880._M_string_length)
    goto LAB_009cf8ac;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1ae0,0,0,local_1880._M_dataplus._M_p,local_1880._M_string_length);
  }
  else {
LAB_009cf8ac:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1880,local_1ae0._M_dataplus._M_p,local_1ae0._M_string_length);
  }
  local_1860._M_dataplus._M_p = (pointer)&local_1860.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if (paVar2 == paVar1) {
    local_1860.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1860.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_1860.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_1860.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1860._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1860._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1b60._M_dataplus._M_p = (pointer)&local_1b60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b60,"gettxoutsetinfo","");
  local_1b80._M_dataplus._M_p = (pointer)&local_1b80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b80,"\"none\"","");
  HelpExampleRpc(&local_1b40,&local_1b60,&local_1b80);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1860._M_dataplus._M_p != &local_1860.field_2) {
    uVar11 = local_1860.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1b40._M_string_length + local_1860._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b40._M_dataplus._M_p != &local_1b40.field_2) {
      uVar11 = local_1b40.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1b40._M_string_length + local_1860._M_string_length)
    goto LAB_009cf9e5;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1b40,0,0,local_1860._M_dataplus._M_p,local_1860._M_string_length);
  }
  else {
LAB_009cf9e5:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1860,local_1b40._M_dataplus._M_p,local_1b40._M_string_length);
  }
  local_1840._M_dataplus._M_p = (pointer)&local_1840.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if (paVar2 == paVar1) {
    local_1840.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1840.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_1840.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_1840.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1840._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1840._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1bc0._M_dataplus._M_p = (pointer)&local_1bc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1bc0,"gettxoutsetinfo","");
  local_1be0._M_dataplus._M_p = (pointer)&local_1be0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1be0,"\"none\", 1000","");
  HelpExampleRpc(&local_1ba0,&local_1bc0,&local_1be0);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1840._M_dataplus._M_p != &local_1840.field_2) {
    uVar11 = local_1840.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1ba0._M_string_length + local_1840._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1ba0._M_dataplus._M_p != &local_1ba0.field_2) {
      uVar11 = local_1ba0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1ba0._M_string_length + local_1840._M_string_length)
    goto LAB_009cfb1e;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1ba0,0,0,local_1840._M_dataplus._M_p,local_1840._M_string_length);
  }
  else {
LAB_009cfb1e:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1840,local_1ba0._M_dataplus._M_p,local_1ba0._M_string_length);
  }
  local_1820._M_dataplus._M_p = (pointer)&local_1820.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if (paVar2 == paVar1) {
    local_1820.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1820.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_1820.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_1820.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1820._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1820._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1c20._M_dataplus._M_p = (pointer)&local_1c20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c20,"gettxoutsetinfo","");
  local_1c40._M_dataplus._M_p = (pointer)&local_1c40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c40,
             "\"none\", \"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"","");
  HelpExampleRpc(&local_1c00,&local_1c20,&local_1c40);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1820._M_dataplus._M_p != &local_1820.field_2) {
    uVar11 = local_1820.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1c00._M_string_length + local_1820._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c00._M_dataplus._M_p != &local_1c00.field_2) {
      uVar11 = local_1c00.field_2._M_allocated_capacity;
    }
    if (local_1c00._M_string_length + local_1820._M_string_length <= (ulong)uVar11) {
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_1c00,0,0,local_1820._M_dataplus._M_p,local_1820._M_string_length);
      goto LAB_009cfc7f;
    }
  }
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_1820,local_1c00._M_dataplus._M_p,local_1c00._M_string_length);
LAB_009cfc7f:
  local_1800 = &local_17f0;
  puVar3 = (ulong *)(pbVar10->_M_dataplus)._M_p;
  paVar1 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_17f0 = paVar1->_M_allocated_capacity;
    uStack_17e8 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
  }
  else {
    local_17f0 = paVar1->_M_allocated_capacity;
    local_1800 = puVar3;
  }
  local_17d8 = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar10->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_1800 == &local_17f0) {
    uStack_17c8 = uStack_17e8;
    local_17e0 = &local_17d0;
  }
  else {
    local_17e0 = local_1800;
  }
  local_17d0 = local_17f0;
  local_17f8 = 0;
  local_17f0 = local_17f0 & 0xffffffffffffff00;
  pcVar16 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:985:9)>
            ::_M_manager;
  name_02._8_16_ = in_stack_ffffffffffffe0c0;
  name_02._M_dataplus._M_p = &stack0xffffffffffffe0e8;
  name_02.field_2._8_8_ = in_RDI;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:985:9)>
                  ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:985:9)>
                  ::_M_manager;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe108;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe110;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar18;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe130;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar19;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar20;
  examples.m_examples.field_2._8_8_ = pRVar21;
  local_1800 = &local_17f0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_02,(string)ZEXT1632(CONCAT88(pRVar15,in_stack_ffffffffffffe0d8)),args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar16 != (code *)0x0) {
    (*pcVar16)(&stack0xffffffffffffe0e8,&stack0xffffffffffffe0e8,3);
  }
  if (local_17e0 != &local_17d0) {
    operator_delete(local_17e0,local_17d0 + 1);
  }
  if (local_1800 != &local_17f0) {
    operator_delete(local_1800,local_17f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c00._M_dataplus._M_p != &local_1c00.field_2) {
    operator_delete(local_1c00._M_dataplus._M_p,local_1c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c40._M_dataplus._M_p != &local_1c40.field_2) {
    operator_delete(local_1c40._M_dataplus._M_p,local_1c40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c20._M_dataplus._M_p != &local_1c20.field_2) {
    operator_delete(local_1c20._M_dataplus._M_p,local_1c20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1820._M_dataplus._M_p != &local_1820.field_2) {
    operator_delete(local_1820._M_dataplus._M_p,local_1820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ba0._M_dataplus._M_p != &local_1ba0.field_2) {
    operator_delete(local_1ba0._M_dataplus._M_p,local_1ba0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1be0._M_dataplus._M_p != &local_1be0.field_2) {
    operator_delete(local_1be0._M_dataplus._M_p,local_1be0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1bc0._M_dataplus._M_p != &local_1bc0.field_2) {
    operator_delete(local_1bc0._M_dataplus._M_p,local_1bc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1840._M_dataplus._M_p != &local_1840.field_2) {
    operator_delete(local_1840._M_dataplus._M_p,local_1840.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b40._M_dataplus._M_p != &local_1b40.field_2) {
    operator_delete(local_1b40._M_dataplus._M_p,local_1b40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b80._M_dataplus._M_p != &local_1b80.field_2) {
    operator_delete(local_1b80._M_dataplus._M_p,local_1b80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b60._M_dataplus._M_p != &local_1b60.field_2) {
    operator_delete(local_1b60._M_dataplus._M_p,local_1b60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1860._M_dataplus._M_p != &local_1860.field_2) {
    operator_delete(local_1860._M_dataplus._M_p,local_1860.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ae0._M_dataplus._M_p != &local_1ae0.field_2) {
    operator_delete(local_1ae0._M_dataplus._M_p,local_1ae0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b20._M_dataplus._M_p != &local_1b20.field_2) {
    operator_delete(local_1b20._M_dataplus._M_p,local_1b20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b00._M_dataplus._M_p != &local_1b00.field_2) {
    operator_delete(local_1b00._M_dataplus._M_p,local_1b00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
    operator_delete(local_1880._M_dataplus._M_p,local_1880.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a80._M_dataplus._M_p != &local_1a80.field_2) {
    operator_delete(local_1a80._M_dataplus._M_p,local_1a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ac0._M_dataplus._M_p != &local_1ac0.field_2) {
    operator_delete(local_1ac0._M_dataplus._M_p,local_1ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1aa0._M_dataplus._M_p != &local_1aa0.field_2) {
    operator_delete(local_1aa0._M_dataplus._M_p,local_1aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
    operator_delete(local_18a0._M_dataplus._M_p,local_18a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a20._M_dataplus._M_p != &local_1a20.field_2) {
    operator_delete(local_1a20._M_dataplus._M_p,local_1a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a60._M_dataplus._M_p != &local_1a60.field_2) {
    operator_delete(local_1a60._M_dataplus._M_p,local_1a60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a40._M_dataplus._M_p != &local_1a40.field_2) {
    operator_delete(local_1a40._M_dataplus._M_p,local_1a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18c0._M_dataplus._M_p != &local_18c0.field_2) {
    operator_delete(local_18c0._M_dataplus._M_p,local_18c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19c0._M_dataplus._M_p != &local_19c0.field_2) {
    operator_delete(local_19c0._M_dataplus._M_p,local_19c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a00._M_dataplus._M_p != &local_1a00.field_2) {
    operator_delete(local_1a00._M_dataplus._M_p,local_1a00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19e0._M_dataplus._M_p != &local_19e0.field_2) {
    operator_delete(local_19e0._M_dataplus._M_p,local_19e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18e0._M_dataplus._M_p != &local_18e0.field_2) {
    operator_delete(local_18e0._M_dataplus._M_p,local_18e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1960._M_dataplus._M_p != &local_1960.field_2) {
    operator_delete(local_1960._M_dataplus._M_p,local_1960.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19a0._M_dataplus._M_p != &local_19a0.field_2) {
    operator_delete(local_19a0._M_dataplus._M_p,local_19a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1980._M_dataplus._M_p != &local_1980.field_2) {
    operator_delete(local_1980._M_dataplus._M_p,local_1980.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1900._M_dataplus._M_p != &local_1900.field_2) {
    operator_delete(local_1900._M_dataplus._M_p,local_1900.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1940._M_dataplus._M_p != &local_1940.field_2) {
    operator_delete(local_1940._M_dataplus._M_p,local_1940.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1920._M_dataplus._M_p != &local_1920.field_2) {
    operator_delete(local_1920._M_dataplus._M_p,local_1920.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c78.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0.m_cond._M_dataplus._M_p != &local_7e0.m_cond.field_2) {
    operator_delete(local_7e0.m_cond._M_dataplus._M_p,
                    local_7e0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0.m_description._M_dataplus._M_p != &local_7e0.m_description.field_2) {
    operator_delete(local_7e0.m_description._M_dataplus._M_p,
                    local_7e0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7e0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0.m_key_name._M_dataplus._M_p != &local_7e0.m_key_name.field_2) {
    operator_delete(local_7e0.m_key_name._M_dataplus._M_p,
                    local_7e0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c90);
  lVar13 = 0x5d8;
  do {
    if ((long *)(local_e08 + lVar13) != *(long **)((long)local_e18 + lVar13)) {
      operator_delete(*(long **)((long)local_e18 + lVar13),*(long *)(local_e08 + lVar13) + 1);
    }
    if ((long *)((long)local_e28 + lVar13) != *(long **)((long)local_e38 + lVar13)) {
      operator_delete(*(long **)((long)local_e38 + lVar13),*(long *)((long)local_e28 + lVar13) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar13));
    if ((long *)((long)local_e68 + lVar13) != *(long **)((long)local_e78 + lVar13)) {
      operator_delete(*(long **)((long)local_e78 + lVar13),*(long *)((long)local_e68 + lVar13) + 1);
    }
    lVar13 = lVar13 + -0x88;
  } while (lVar13 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1de0);
  lVar13 = 0x2a8;
  do {
    if ((long *)(local_1370 + lVar13) != *(long **)((long)local_1380 + lVar13)) {
      operator_delete(*(long **)((long)local_1380 + lVar13),*(long *)(local_1370 + lVar13) + 1);
    }
    if ((long *)((long)local_1390 + lVar13) != *(long **)((long)local_13a0 + lVar13)) {
      operator_delete(*(long **)((long)local_13a0 + lVar13),*(long *)((long)local_1390 + lVar13) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_13c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar13));
    if ((long *)((long)local_13d0 + lVar13) != *(long **)((long)local_13e0 + lVar13)) {
      operator_delete(*(long **)((long)local_13e0 + lVar13),*(long *)((long)local_13d0 + lVar13) + 1
                     );
    }
    lVar13 = lVar13 + -0x88;
  } while (lVar13 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe190);
  lVar13 = 0x220;
  do {
    if ((long *)(local_16d0 + lVar13) != *(long **)((long)local_16e0 + lVar13)) {
      operator_delete(*(long **)((long)local_16e0 + lVar13),*(long *)(local_16d0 + lVar13) + 1);
    }
    if ((long *)((long)local_16f0 + lVar13) != *(long **)((long)local_1700 + lVar13)) {
      operator_delete(*(long **)((long)local_1700 + lVar13),*(long *)((long)local_16f0 + lVar13) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1720.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar13));
    if ((long *)((long)local_1730 + lVar13) != *(long **)((long)local_1740 + lVar13)) {
      operator_delete(*(long **)((long)local_1740 + lVar13),*(long *)((long)local_1730 + lVar13) + 1
                     );
    }
    lVar13 = lVar13 + -0x88;
  } while (lVar13 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe118);
  if (local_17c0[0] != local_17b0) {
    operator_delete(local_17c0[0],local_17b0[0] + 1);
  }
  if (local_17a0[0] != local_1790) {
    operator_delete(local_17a0[0],local_1790[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe138);
  if (local_1780[0] != local_1770) {
    operator_delete(local_1780[0],local_1770[0] + 1);
  }
  if (local_1760[0] != local_1750) {
    operator_delete(local_1760[0],local_1750[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe158);
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] + 1);
  }
  if (local_1720.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1720.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1720.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1720.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe178);
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] + 1);
  }
  if (local_16e0[0] != (pointer)local_16d0) {
    operator_delete(local_16e0[0],local_16d0._0_8_ + 1);
  }
  if (local_14a0[0] != local_1490) {
    operator_delete(local_14a0[0],local_1490[0] + 1);
  }
  if (local_1480[0] != local_1470) {
    operator_delete(local_1480[0],local_1470[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e58);
  if (local_1460[0] != local_1450) {
    operator_delete(local_1460[0],local_1450[0] + 1);
  }
  if (local_1440[0] != local_1430) {
    operator_delete(local_1440[0],local_1430[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e38);
  if (local_1420[0] != local_1410) {
    operator_delete(local_1420[0],local_1410[0] + 1);
  }
  if (local_1400[0] != local_13f0) {
    operator_delete(local_1400[0],local_13f0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e18);
  if (local_13e0[0] != local_13d0) {
    operator_delete(local_13e0[0],local_13d0[0] + 1);
  }
  if (local_13c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_13c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_13c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_13c0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1df8);
  if (local_13a0[0] != local_1390) {
    operator_delete(local_13a0[0],local_1390[0] + 1);
  }
  if (local_1380[0] != (pointer)local_1370) {
    operator_delete(local_1380[0],local_1370._0_8_ + 1);
  }
  if (local_10b8[0] != local_10a8) {
    operator_delete(local_10b8[0],local_10a8[0] + 1);
  }
  if (local_1098[0] != local_1088) {
    operator_delete(local_1098[0],local_1088[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1dc8);
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0],local_1068[0] + 1);
  }
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0],local_1048[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1da8);
  if (local_1038 != local_1028) {
    operator_delete(local_1038,local_1028[0] + 1);
  }
  if (local_1018[0] != local_1008) {
    operator_delete(local_1018[0],local_1008[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d88);
  if (local_ff8[0] != local_fe8) {
    operator_delete(local_ff8[0],local_fe8[0] + 1);
  }
  if (local_fd8[0] != local_fc8) {
    operator_delete(local_fd8[0],local_fc8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d68);
  if (local_fb8[0] != local_fa8) {
    operator_delete(local_fb8[0],local_fa8[0] + 1);
  }
  if (local_f98[0] != local_f88) {
    operator_delete(local_f98[0],local_f88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d48);
  if (local_f78[0] != local_f68) {
    operator_delete(local_f78[0],local_f68[0] + 1);
  }
  if (local_f58[0] != local_f48) {
    operator_delete(local_f58[0],local_f48[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d28);
  if (local_f38[0] != local_f28) {
    operator_delete(local_f38[0],local_f28[0] + 1);
  }
  if (local_f18[0] != local_f08) {
    operator_delete(local_f18[0],local_f08[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d08);
  if (local_ef8[0] != local_ee8) {
    operator_delete(local_ef8[0],local_ee8[0] + 1);
  }
  if (local_ed8[0] != local_ec8) {
    operator_delete(local_ed8[0],local_ec8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ce8);
  if (local_eb8[0] != local_ea8) {
    operator_delete(local_eb8[0],local_ea8[0] + 1);
  }
  if (local_e98[0] != local_e88) {
    operator_delete(local_e98[0],local_e88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1cc8);
  if (local_e78[0] != local_e68) {
    operator_delete(local_e78[0],local_e68[0] + 1);
  }
  if (local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_e58.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ca8);
  if (local_e38[0] != local_e28) {
    operator_delete(local_e38[0],local_e28[0] + 1);
  }
  if (local_e18[0] != (pointer)local_e08) {
    operator_delete(local_e18[0],local_e08._0_8_ + 1);
  }
  if (local_820[0] != local_810) {
    operator_delete(local_820[0],local_810[0] + 1);
  }
  if (local_800[0] != local_7f0) {
    operator_delete(local_800[0],local_7f0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1c58);
  lVar13 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar13));
    if ((long *)(local_410 + lVar13 + 0x50) != *(long **)(local_410 + lVar13 + 0x40)) {
      operator_delete(*(long **)(local_410 + lVar13 + 0x40),*(long *)(local_410 + lVar13 + 0x50) + 1
                     );
    }
    if ((long *)(local_410 + lVar13 + 0x28) != *(long **)(local_410 + lVar13 + 0x18)) {
      operator_delete(*(long **)(local_410 + lVar13 + 0x18),*(long *)(local_410 + lVar13 + 0x28) + 1
                     );
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_468 + lVar13 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_470 + lVar13));
    if ((long *)((long)local_488 + lVar13) != *(long **)(local_4a8 + lVar13 + 0x10)) {
      operator_delete(*(long **)(local_4a8 + lVar13 + 0x10),*(long *)((long)local_488 + lVar13) + 1)
      ;
    }
    lVar13 = lVar13 + -0x108;
  } while (lVar13 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_730);
  if (local_750 != &local_740) {
    operator_delete(local_750,CONCAT71(uStack_73f,local_740) + 1);
  }
  if (local_710[0] != local_700) {
    operator_delete(local_710[0],local_700[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_698._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6f0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6f0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.val._M_dataplus._M_p != &local_6f0.val.field_2) {
    operator_delete(local_6f0.val._M_dataplus._M_p,
                    CONCAT71(local_6f0.val.field_2._M_allocated_capacity._1_7_,
                             local_6f0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_638[0] != local_628) {
    operator_delete(local_638[0],local_628[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5b0);
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,CONCAT71(uStack_5bf,local_5c0) + 1);
  }
  lVar13 = -0x40;
  plVar12 = local_5e8;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0);
  if (local_590[0] != local_580) {
    operator_delete(local_590[0],local_580[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_550._M_first);
  if (local_570 != &local_560) {
    operator_delete(local_570,CONCAT44(uStack_55c,local_560) + 1);
  }
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0],local_4e0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4a8);
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
  }
  if (local_488[0] != &local_478) {
    operator_delete(local_488[0],local_478 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_410);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._8_8_ != &local_450) {
    operator_delete((void *)local_468._8_8_,
                    CONCAT71(local_450._M_allocated_capacity._1_7_,local_450._M_local_buf[0]) + 1);
  }
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxoutsetinfo()
{
    return RPCHelpMan{"gettxoutsetinfo",
                "\nReturns statistics about the unspent transaction output set.\n"
                "Note this call may take some time if you are not using coinstatsindex.\n",
                {
                    {"hash_type", RPCArg::Type::STR, RPCArg::Default{"hash_serialized_3"}, "Which UTXO set hash should be calculated. Options: 'hash_serialized_3' (the legacy algorithm), 'muhash', 'none'."},
                    {"hash_or_height", RPCArg::Type::NUM, RPCArg::DefaultHint{"the current best block"}, "The block hash or height of the target height (only available with coinstatsindex).",
                     RPCArgOptions{
                         .skip_type_check = true,
                         .type_str = {"", "string or numeric"},
                     }},
                    {"use_index", RPCArg::Type::BOOL, RPCArg::Default{true}, "Use coinstatsindex, if available."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM, "height", "The block height (index) of the returned statistics"},
                        {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at which these statistics are calculated"},
                        {RPCResult::Type::NUM, "txouts", "The number of unspent transaction outputs"},
                        {RPCResult::Type::NUM, "bogosize", "Database-independent, meaningless metric indicating the UTXO set size"},
                        {RPCResult::Type::STR_HEX, "hash_serialized_3", /*optional=*/true, "The serialized hash (only present if 'hash_serialized_3' hash_type is chosen)"},
                        {RPCResult::Type::STR_HEX, "muhash", /*optional=*/true, "The serialized hash (only present if 'muhash' hash_type is chosen)"},
                        {RPCResult::Type::NUM, "transactions", /*optional=*/true, "The number of transactions with unspent outputs (not available when coinstatsindex is used)"},
                        {RPCResult::Type::NUM, "disk_size", /*optional=*/true, "The estimated size of the chainstate on disk (not available when coinstatsindex is used)"},
                        {RPCResult::Type::STR_AMOUNT, "total_amount", "The total amount of coins in the UTXO set"},
                        {RPCResult::Type::STR_AMOUNT, "total_unspendable_amount", /*optional=*/true, "The total amount of coins permanently excluded from the UTXO set (only available if coinstatsindex is used)"},
                        {RPCResult::Type::OBJ, "block_info", /*optional=*/true, "Info on amounts in the block at this block height (only available if coinstatsindex is used)",
                        {
                            {RPCResult::Type::STR_AMOUNT, "prevout_spent", "Total amount of all prevouts spent in this block"},
                            {RPCResult::Type::STR_AMOUNT, "coinbase", "Coinbase subsidy amount of this block"},
                            {RPCResult::Type::STR_AMOUNT, "new_outputs_ex_coinbase", "Total amount of new outputs created by this block"},
                            {RPCResult::Type::STR_AMOUNT, "unspendable", "Total amount of unspendable outputs created in this block"},
                            {RPCResult::Type::OBJ, "unspendables", "Detailed view of the unspendable categories",
                            {
                                {RPCResult::Type::STR_AMOUNT, "genesis_block", "The unspendable amount of the Genesis block subsidy"},
                                {RPCResult::Type::STR_AMOUNT, "bip30", "Transactions overridden by duplicates (no longer possible with BIP30)"},
                                {RPCResult::Type::STR_AMOUNT, "scripts", "Amounts sent to scripts that are unspendable (for example OP_RETURN outputs)"},
                                {RPCResult::Type::STR_AMOUNT, "unclaimed_rewards", "Fee rewards that miners did not claim in their coinbase transaction"},
                            }}
                        }},
                    }},
                RPCExamples{
                    HelpExampleCli("gettxoutsetinfo", "") +
                    HelpExampleCli("gettxoutsetinfo", R"("none")") +
                    HelpExampleCli("gettxoutsetinfo", R"("none" 1000)") +
                    HelpExampleCli("gettxoutsetinfo", R"("none" '"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09"')") +
                    HelpExampleCli("-named gettxoutsetinfo", R"(hash_type='muhash' use_index='false')") +
                    HelpExampleRpc("gettxoutsetinfo", "") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none")") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none", 1000)") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none", "00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09")")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue ret(UniValue::VOBJ);

    const CBlockIndex* pindex{nullptr};
    const CoinStatsHashType hash_type{request.params[0].isNull() ? CoinStatsHashType::HASH_SERIALIZED : ParseHashType(request.params[0].get_str())};
    bool index_requested = request.params[2].isNull() || request.params[2].get_bool();

    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    Chainstate& active_chainstate = chainman.ActiveChainstate();
    active_chainstate.ForceFlushStateToDisk();

    CCoinsView* coins_view;
    BlockManager* blockman;
    {
        LOCK(::cs_main);
        coins_view = &active_chainstate.CoinsDB();
        blockman = &active_chainstate.m_blockman;
        pindex = blockman->LookupBlockIndex(coins_view->GetBestBlock());
    }

    if (!request.params[1].isNull()) {
        if (!g_coin_stats_index) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Querying specific block heights requires coinstatsindex");
        }

        if (hash_type == CoinStatsHashType::HASH_SERIALIZED) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "hash_serialized_3 hash type cannot be queried for a specific block");
        }

        if (!index_requested) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot set use_index to false when querying for a specific block");
        }
        pindex = ParseHashOrHeight(request.params[1], chainman);
    }

    if (index_requested && g_coin_stats_index) {
        if (!g_coin_stats_index->BlockUntilSyncedToCurrentChain()) {
            const IndexSummary summary{g_coin_stats_index->GetSummary()};

            // If a specific block was requested and the index has already synced past that height, we can return the
            // data already even though the index is not fully synced yet.
            if (pindex->nHeight > summary.best_block_height) {
                throw JSONRPCError(RPC_INTERNAL_ERROR, strprintf("Unable to get data because coinstatsindex is still syncing. Current height: %d", summary.best_block_height));
            }
        }
    }

    const std::optional<CCoinsStats> maybe_stats = GetUTXOStats(coins_view, *blockman, hash_type, node.rpc_interruption_point, pindex, index_requested);
    if (maybe_stats.has_value()) {
        const CCoinsStats& stats = maybe_stats.value();
        ret.pushKV("height", (int64_t)stats.nHeight);
        ret.pushKV("bestblock", stats.hashBlock.GetHex());
        ret.pushKV("txouts", (int64_t)stats.nTransactionOutputs);
        ret.pushKV("bogosize", (int64_t)stats.nBogoSize);
        if (hash_type == CoinStatsHashType::HASH_SERIALIZED) {
            ret.pushKV("hash_serialized_3", stats.hashSerialized.GetHex());
        }
        if (hash_type == CoinStatsHashType::MUHASH) {
            ret.pushKV("muhash", stats.hashSerialized.GetHex());
        }
        CHECK_NONFATAL(stats.total_amount.has_value());
        ret.pushKV("total_amount", ValueFromAmount(stats.total_amount.value()));
        if (!stats.index_used) {
            ret.pushKV("transactions", static_cast<int64_t>(stats.nTransactions));
            ret.pushKV("disk_size", stats.nDiskSize);
        } else {
            ret.pushKV("total_unspendable_amount", ValueFromAmount(stats.total_unspendable_amount));

            CCoinsStats prev_stats{};
            if (pindex->nHeight > 0) {
                const std::optional<CCoinsStats> maybe_prev_stats = GetUTXOStats(coins_view, *blockman, hash_type, node.rpc_interruption_point, pindex->pprev, index_requested);
                if (!maybe_prev_stats) {
                    throw JSONRPCError(RPC_INTERNAL_ERROR, "Unable to read UTXO set");
                }
                prev_stats = maybe_prev_stats.value();
            }

            UniValue block_info(UniValue::VOBJ);
            block_info.pushKV("prevout_spent", ValueFromAmount(stats.total_prevout_spent_amount - prev_stats.total_prevout_spent_amount));
            block_info.pushKV("coinbase", ValueFromAmount(stats.total_coinbase_amount - prev_stats.total_coinbase_amount));
            block_info.pushKV("new_outputs_ex_coinbase", ValueFromAmount(stats.total_new_outputs_ex_coinbase_amount - prev_stats.total_new_outputs_ex_coinbase_amount));
            block_info.pushKV("unspendable", ValueFromAmount(stats.total_unspendable_amount - prev_stats.total_unspendable_amount));

            UniValue unspendables(UniValue::VOBJ);
            unspendables.pushKV("genesis_block", ValueFromAmount(stats.total_unspendables_genesis_block - prev_stats.total_unspendables_genesis_block));
            unspendables.pushKV("bip30", ValueFromAmount(stats.total_unspendables_bip30 - prev_stats.total_unspendables_bip30));
            unspendables.pushKV("scripts", ValueFromAmount(stats.total_unspendables_scripts - prev_stats.total_unspendables_scripts));
            unspendables.pushKV("unclaimed_rewards", ValueFromAmount(stats.total_unspendables_unclaimed_rewards - prev_stats.total_unspendables_unclaimed_rewards));
            block_info.pushKV("unspendables", std::move(unspendables));

            ret.pushKV("block_info", std::move(block_info));
        }
    } else {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Unable to read UTXO set");
    }
    return ret;
},
    };
}